

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_async_policy::get_async
          (_async_policy *this,io_service *io_srv,service *srv)

{
  unspecified_bool_type uVar1;
  cppcms_error *this_00;
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  application *in_RDI;
  string *in_stack_ffffffffffffff78;
  intrusive_ptr<cppcms::application> *in_stack_ffffffffffffff80;
  application *in_stack_ffffffffffffff88;
  allocator *paVar2;
  application *this_01;
  allocator local_41;
  string local_40 [32];
  long local_20;
  long local_18;
  
  this_01 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  uVar1 = booster::intrusive_ptr::operator_cast_to__((intrusive_ptr *)(in_RSI + 3));
  if (uVar1 == 0xffffffffffffffff) {
    if (local_20 == 0) {
      booster::intrusive_ptr<cppcms::application>::intrusive_ptr
                ((intrusive_ptr<cppcms::application> *)this_01,in_stack_ffffffffffffff88,
                 SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
    }
    else {
      (**(code **)(*in_RSI + 0x28))(this_01,in_RSI,local_20);
    }
  }
  else {
    if (local_18 != in_RSI[4]) {
      this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
      paVar2 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_40,"given booster::aio::io_service isn\'t main event loop io_service",paVar2)
      ;
      cppcms_error::cppcms_error(this_00,in_stack_ffffffffffffff78);
      __cxa_throw(this_00,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
    }
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              (in_stack_ffffffffffffff80,
               (intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffff78);
  }
  return (intrusive_ptr<cppcms::application>)in_RDI;
}

Assistant:

virtual booster::intrusive_ptr<application> get_async(booster::aio::io_service &io_srv,cppcms::service *srv = 0) 
	{

		if(app_) {
			if(&io_srv == io_srv_)
				return app_;
			else
				throw cppcms_error("given booster::aio::io_service isn't main event loop io_service");
		}
		if(!srv)
			return 0;
		return get(*srv);
	}